

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O0

DdNode * cuddBddXorRecur(DdManager *manager,DdNode *f,DdNode *g)

{
  DdManager *pDVar1;
  uint *puVar2;
  DdNode *T;
  DdNode *E;
  DdNode *pDVar3;
  DdNode *tmp;
  uint index;
  uint topg;
  uint topf;
  DdNode *e;
  DdNode *t;
  DdNode *r;
  DdNode *zero;
  DdNode *one;
  DdNode *gnv;
  DdNode *gv;
  DdNode *G;
  DdNode *fnv;
  DdNode *fv;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *manager_local;
  
  pDVar1 = (DdManager *)manager->one;
  manager_local = (DdManager *)((ulong)pDVar1 ^ 1);
  if ((f != g) && (manager_local = pDVar1, f != (DdNode *)((ulong)g ^ 1))) {
    fv = g;
    g_local = f;
    if ((*(long *)(((ulong)g & 0xfffffffffffffffe) + 0x20) << 1 | (long)(int)((uint)g & 1)) <
        (*(long *)(((ulong)f & 0xfffffffffffffffe) + 0x20) << 1 | (long)(int)((uint)f & 1))) {
      fv = f;
      g_local = g;
    }
    if ((DdManager *)fv == (DdManager *)((ulong)pDVar1 ^ 1)) {
      manager_local = (DdManager *)g_local;
    }
    else if ((DdManager *)fv == pDVar1) {
      manager_local = (DdManager *)((ulong)g_local ^ 1);
    }
    else {
      if (((ulong)g_local & 1) != 0) {
        g_local = (DdNode *)((ulong)g_local ^ 1);
        fv = (DdNode *)((ulong)fv ^ 1);
      }
      if ((DdManager *)g_local == pDVar1) {
        manager_local = (DdManager *)((ulong)fv ^ 1);
      }
      else {
        manager_local = (DdManager *)cuddCacheLookup2(manager,Cudd_bddXor,g_local,fv);
        if (manager_local == (DdManager *)0x0) {
          puVar2 = (uint *)((ulong)fv & 0xfffffffffffffffe);
          if ((uint)manager->perm[*puVar2] < (uint)manager->perm[g_local->index]) {
            tmp._4_4_ = *puVar2;
            G = g_local;
            fnv = g_local;
          }
          else {
            tmp._4_4_ = g_local->index;
            fnv = (g_local->type).kids.T;
            G = (g_local->type).kids.E;
          }
          if ((uint)manager->perm[g_local->index] < (uint)manager->perm[*puVar2]) {
            one = fv;
            gnv = fv;
          }
          else {
            gnv = *(DdNode **)(puVar2 + 4);
            one = *(DdNode **)(puVar2 + 6);
            if (((ulong)fv & 1) != 0) {
              gnv = (DdNode *)((ulong)gnv ^ 1);
              one = (DdNode *)((ulong)one ^ 1);
            }
          }
          T = cuddBddXorRecur(manager,fnv,gnv);
          if (T == (DdNode *)0x0) {
            manager_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + 1;
            E = cuddBddXorRecur(manager,G,one);
            if (E == (DdNode *)0x0) {
              Cudd_IterDerefBdd(manager,T);
              manager_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
              t = T;
              if (T != E) {
                if (((ulong)T & 1) == 0) {
                  t = cuddUniqueInter(manager,tmp._4_4_,T,E);
                  if (t == (DdNode *)0x0) {
                    Cudd_IterDerefBdd(manager,T);
                    Cudd_IterDerefBdd(manager,E);
                    return (DdNode *)0x0;
                  }
                }
                else {
                  pDVar3 = cuddUniqueInter(manager,tmp._4_4_,(DdNode *)((ulong)T ^ 1),
                                           (DdNode *)((ulong)E ^ 1));
                  if (pDVar3 == (DdNode *)0x0) {
                    Cudd_IterDerefBdd(manager,T);
                    Cudd_IterDerefBdd(manager,E);
                    return (DdNode *)0x0;
                  }
                  t = (DdNode *)((ulong)pDVar3 ^ 1);
                }
              }
              *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
              *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + -1;
              cuddCacheInsert2(manager,Cudd_bddXor,g_local,fv,t);
              manager_local = (DdManager *)t;
            }
          }
        }
      }
    }
  }
  return &manager_local->sentinel;
}

Assistant:

DdNode *
cuddBddXorRecur(
  DdManager * manager,
  DdNode * f,
  DdNode * g)
{
    DdNode *fv, *fnv, *G, *gv, *gnv;
    DdNode *one, *zero, *r, *t, *e;
    unsigned int topf, topg, index;

    statLine(manager);
    one = DD_ONE(manager);
    zero = Cudd_Not(one);

    /* Terminal cases. */
    if (f == g) return(zero);
    if (f == Cudd_Not(g)) return(one);
    if (cuddF2L(f) > cuddF2L(g)) { /* Try to increase cache efficiency and simplify tests. */
        DdNode *tmp = f;
        f = g;
        g = tmp;
    }
    if (g == zero) return(f);
    if (g == one) return(Cudd_Not(f));
    if (Cudd_IsComplement(f)) {
        f = Cudd_Not(f);
        g = Cudd_Not(g);
    }
    /* Now the first argument is regular. */
    if (f == one) return(Cudd_Not(g));

    /* At this point f and g are not constant. */

    /* Check cache. */
    r = cuddCacheLookup2(manager, Cudd_bddXor, f, g);
    if (r != NULL) return(r);

    /* Here we can skip the use of cuddI, because the operands are known
    ** to be non-constant.
    */
    topf = manager->perm[f->index];
    G = Cudd_Regular(g);
    topg = manager->perm[G->index];

    /* Compute cofactors. */
    if (topf <= topg) {
        index = f->index;
        fv = cuddT(f);
        fnv = cuddE(f);
    } else {
        index = G->index;
        fv = fnv = f;
    }

    if (topg <= topf) {
        gv = cuddT(G);
        gnv = cuddE(G);
        if (Cudd_IsComplement(g)) {
            gv = Cudd_Not(gv);
            gnv = Cudd_Not(gnv);
        }
    } else {
        gv = gnv = g;
    }

    t = cuddBddXorRecur(manager, fv, gv);
    if (t == NULL) return(NULL);
    cuddRef(t);

    e = cuddBddXorRecur(manager, fnv, gnv);
    if (e == NULL) {
        Cudd_IterDerefBdd(manager, t);
        return(NULL);
    }
    cuddRef(e);

    if (t == e) {
        r = t;
    } else {
        if (Cudd_IsComplement(t)) {
            r = cuddUniqueInter(manager,(int)index,Cudd_Not(t),Cudd_Not(e));
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
            r = Cudd_Not(r);
        } else {
            r = cuddUniqueInter(manager,(int)index,t,e);
            if (r == NULL) {
                Cudd_IterDerefBdd(manager, t);
                Cudd_IterDerefBdd(manager, e);
                return(NULL);
            }
        }
    }
    cuddDeref(e);
    cuddDeref(t);
    cuddCacheInsert2(manager, Cudd_bddXor, f, g, r);
    return(r);

}